

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O3

QRhiShaderResourceBinding *
QRhiShaderResourceBinding::uniformBuffer
          (QRhiShaderResourceBinding *__return_storage_ptr__,int binding,StageFlags stage,
          QRhiBuffer *buf)

{
  memset(&(__return_storage_ptr__->d).type,0xaa,0x110);
  (__return_storage_ptr__->d).binding = binding;
  (__return_storage_ptr__->d).stage.
  super_QFlagsStorageHelper<QRhiShaderResourceBinding::StageFlag,_4>.
  super_QFlagsStorage<QRhiShaderResourceBinding::StageFlag>.i =
       (Int)stage.super_QFlagsStorageHelper<QRhiShaderResourceBinding::StageFlag,_4>.
            super_QFlagsStorage<QRhiShaderResourceBinding::StageFlag>.i;
  (__return_storage_ptr__->d).type = UniformBuffer;
  (__return_storage_ptr__->d).u.ubuf.buf = buf;
  (__return_storage_ptr__->d).u.stex.texSamplers[0].tex = (QRhiTexture *)0x0;
  (__return_storage_ptr__->d).u.ubuf.hasDynamicOffset = false;
  return __return_storage_ptr__;
}

Assistant:

QRhiShaderResourceBinding QRhiShaderResourceBinding::uniformBuffer(
        int binding, StageFlags stage, QRhiBuffer *buf)
{
    QRhiShaderResourceBinding b;
    b.d.binding = binding;
    b.d.stage = stage;
    b.d.type = UniformBuffer;
    b.d.u.ubuf.buf = buf;
    b.d.u.ubuf.offset = 0;
    b.d.u.ubuf.maybeSize = 0; // entire buffer
    b.d.u.ubuf.hasDynamicOffset = false;
    return b;
}